

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void absl::LockEnter(Mutex *mu,GraphId id,SynchLocksHeld *held_locks)

{
  int32_t *piVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint uVar4;
  ulong uVar5;
  GraphId *pGVar6;
  bool bVar7;
  
  uVar2 = held_locks->n;
  bVar7 = (ulong)uVar2 == 0;
  if (bVar7) {
    uVar4 = 0;
  }
  else {
    if (held_locks->locks[0].id.handle == id.handle) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      pGVar6 = &held_locks->locks[1].id;
      do {
        bVar7 = (ulong)uVar2 - 1 == uVar5;
        uVar4 = uVar2;
        if (bVar7) goto LAB_00145ce2;
        uVar5 = uVar5 + 1;
        puVar3 = &pGVar6->handle;
        pGVar6 = pGVar6 + 3;
      } while (*puVar3 != id.handle);
    }
    uVar4 = (uint)uVar5;
    if (!bVar7) {
      piVar1 = &held_locks->locks[uVar5 & 0xffffffff].count;
      *piVar1 = *piVar1 + 1;
      return;
    }
  }
LAB_00145ce2:
  if (uVar2 != 0x28) {
    held_locks->locks[uVar4].mu = mu;
    held_locks->locks[uVar4].count = 1;
    held_locks->locks[uVar4].id.handle = id.handle;
    held_locks->n = uVar2 + 1;
    return;
  }
  held_locks->overflow = true;
  return;
}

Assistant:

static void LockEnter(Mutex* mu, GraphId id, SynchLocksHeld *held_locks) {
  int n = held_locks->n;
  int i = 0;
  while (i != n && held_locks->locks[i].id != id) {
    i++;
  }
  if (i == n) {
    if (n == ABSL_ARRAYSIZE(held_locks->locks)) {
      held_locks->overflow = true;  // lost some data
    } else {                        // we have room for lock
      held_locks->locks[i].mu = mu;
      held_locks->locks[i].count = 1;
      held_locks->locks[i].id = id;
      held_locks->n = n + 1;
    }
  } else {
    held_locks->locks[i].count++;
  }
}